

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::PrintTopLevelExtensions(Generator *this)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  Printer *this_00;
  FileDescriptor *pFVar4;
  size_type extraout_RDX;
  size_type sVar5;
  FieldDescriptor *field;
  long lVar6;
  string constant_name;
  string local_70;
  string local_50;
  
  pFVar4 = this->file_;
  if (0 < *(int *)(pFVar4 + 0x88)) {
    lVar6 = 0;
    do {
      lVar1 = *(long *)(pFVar4 + 0x98);
      plVar2 = *(long **)(lVar1 + lVar6 * 0xa8);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      lVar3 = *plVar2;
      std::__cxx11::string::_M_construct<char*>((string *)&local_70,lVar3,plVar2[1] + lVar3);
      std::__cxx11::string::append((char *)&local_70);
      sVar5 = extraout_RDX;
      if (local_70._M_string_length != 0) {
        sVar5 = 0;
        do {
          if ((byte)(local_70._M_dataplus._M_p[sVar5] + 0x9fU) < 0x1a) {
            local_70._M_dataplus._M_p[sVar5] = local_70._M_dataplus._M_p[sVar5] + -0x20;
          }
          sVar5 = sVar5 + 1;
        } while (local_70._M_string_length != sVar5);
      }
      field = (FieldDescriptor *)(lVar1 + lVar6 * 0xa8);
      this_00 = this->printer_;
      SimpleItoa_abi_cxx11_(&local_50,(protobuf *)(ulong)*(uint *)(field + 0x38),(int)sVar5);
      io::Printer::Print(this_00,"$constant_name$ = $number$\n","constant_name",&local_70,"number",
                         &local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      io::Printer::Print(this->printer_,"$name$ = ","name",*(string **)field);
      PrintFieldDescriptor(this,field,true);
      io::Printer::Print(this->printer_,"\n");
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      lVar6 = lVar6 + 1;
      pFVar4 = this->file_;
    } while (lVar6 < *(int *)(pFVar4 + 0x88));
  }
  io::Printer::Print(this->printer_,"\n");
  return;
}

Assistant:

void Generator::PrintTopLevelExtensions() const {
  const bool is_extension = true;
  for (int i = 0; i < file_->extension_count(); ++i) {
    const FieldDescriptor& extension_field = *file_->extension(i);
    string constant_name = extension_field.name() + "_FIELD_NUMBER";
    UpperString(&constant_name);
    printer_->Print("$constant_name$ = $number$\n",
      "constant_name", constant_name,
      "number", SimpleItoa(extension_field.number()));
    printer_->Print("$name$ = ", "name", extension_field.name());
    PrintFieldDescriptor(extension_field, is_extension);
    printer_->Print("\n");
  }
  printer_->Print("\n");
}